

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxyMono.cpp
# Opt level: O3

bool __thiscall
Shell::EqualityProxyMono::getArgumentEqualityLiterals
          (EqualityProxyMono *this,uint cnt,LiteralStack *lits,Stack<Kernel::TermList> *vars1,
          Stack<Kernel::TermList> *vars2,OperatorType *symbolType,bool skipSortsWithoutEquality)

{
  uint predicate;
  TermList sort;
  Entry *pEVar1;
  Literal *pLVar2;
  TermList *pTVar3;
  Literal **ppLVar4;
  Literal **ppLVar5;
  ulong uVar6;
  uint uVar7;
  DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *this_00;
  ulong uVar8;
  TermList local_48;
  ulong local_40;
  ulong local_38;
  
  ppLVar4 = lits->_stack;
  lits->_cursor = ppLVar4;
  vars1->_cursor = vars1->_stack;
  vars2->_cursor = vars2->_stack;
  ppLVar5 = ppLVar4;
  if (cnt != 0) {
    local_38 = (ulong)cnt;
    uVar7 = 5;
    uVar6 = 0;
    do {
      if (uVar6 < symbolType->_typeArgsArity) {
        sort = Kernel::AtomicSort::superSort();
        this_00 = (DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)this
        ;
      }
      else {
        sort._content =
             *(uint64_t *)
              (symbolType->_key + (ulong)((int)uVar6 - symbolType->_typeArgsArity) * 8 + 8);
        this_00 = (DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)this
        ;
      }
      uVar8 = (ulong)(uVar7 - 4);
      if (skipSortsWithoutEquality) {
        this_00 = &s_proxyPredicates;
        local_48._content = sort._content;
        pEVar1 = Lib::DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::
                 findEntry(&s_proxyPredicates,&local_48);
        if (pEVar1 != (Entry *)0x0) goto LAB_006d143a;
        pTVar3 = vars1->_cursor;
        if (pTVar3 == vars1->_end) {
          this_00 = (DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                    vars1;
          Lib::Stack<Kernel::TermList>::expand(vars1);
          pTVar3 = vars1->_cursor;
        }
        pTVar3->_content = uVar8;
        vars1->_cursor = pTVar3 + 1;
        pTVar3 = vars2->_cursor;
        if (pTVar3 == vars2->_end) {
          this_00 = (DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                    vars2;
          Lib::Stack<Kernel::TermList>::expand(vars2);
          pTVar3 = vars2->_cursor;
        }
        pTVar3->_content = uVar8;
      }
      else {
LAB_006d143a:
        predicate = getProxyPredicate((EqualityProxyMono *)this_00,sort);
        local_48._content = uVar8;
        local_40 = (ulong)uVar7;
        pLVar2 = Kernel::Literal::create(predicate,2,false,&local_48);
        ppLVar4 = lits->_cursor;
        if (ppLVar4 == lits->_end) {
          Lib::Stack<Kernel::Literal_*>::expand(lits);
          ppLVar4 = lits->_cursor;
        }
        *ppLVar4 = pLVar2;
        lits->_cursor = lits->_cursor + 1;
        pTVar3 = vars1->_cursor;
        this_00 = (DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)lits
        ;
        if (pTVar3 == vars1->_end) {
          this_00 = (DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                    vars1;
          Lib::Stack<Kernel::TermList>::expand(vars1);
          pTVar3 = vars1->_cursor;
        }
        pTVar3->_content = uVar8;
        vars1->_cursor = pTVar3 + 1;
        pTVar3 = vars2->_cursor;
        if (pTVar3 == vars2->_end) {
          this_00 = (DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                    vars2;
          Lib::Stack<Kernel::TermList>::expand(vars2);
          pTVar3 = vars2->_cursor;
        }
        pTVar3->_content = (ulong)uVar7;
      }
      vars2->_cursor = pTVar3 + 1;
      uVar6 = uVar6 + 1;
      uVar7 = uVar7 + 8;
      this = (EqualityProxyMono *)this_00;
    } while (local_38 != uVar6);
    ppLVar4 = lits->_stack;
    ppLVar5 = lits->_cursor;
  }
  return ppLVar5 != ppLVar4;
}

Assistant:

bool EqualityProxyMono::getArgumentEqualityLiterals(unsigned cnt, LiteralStack& lits,
    Stack<TermList>& vars1, Stack<TermList>& vars2, OperatorType* symbolType, bool skipSortsWithoutEquality)
{
  ASS_EQ(cnt, symbolType->arity());

  lits.reset();
  vars1.reset();
  vars2.reset();

  for (unsigned i=0; i<cnt; i++) {
    TermList v1(2*i, false);
    TermList v2(2*i+1, false);
    TermList sort = symbolType->arg(i);
    if (!skipSortsWithoutEquality || haveProxyPredicate(sort)) {
      lits.push(makeProxyLiteral(false, v1, v2, sort));
      vars1.push(v1);
      vars2.push(v2);
    }
    else {
      vars1.push(v1);
      vars2.push(v1);
    }
  }
  return lits.isNonEmpty();
}